

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polpak.cpp
# Opt level: O1

int phi(int n)

{
  int iVar1;
  int iVar2;
  long lVar3;
  double dVar4;
  int local_d8 [2];
  int factor [20];
  int power [20];
  int local_30;
  int local_2c;
  int nleft;
  int nfactor;
  
  if (n < 1) {
    iVar2 = 0;
  }
  else {
    iVar2 = 1;
    if (n != 1) {
      i4_factor(n,0x14,&local_2c,local_d8,factor + 0x12,&local_30);
      if (local_30 != 1) {
        std::operator<<((ostream *)&std::cerr,"\n");
        std::operator<<((ostream *)&std::cerr,"PHI - Fatal error!\n");
        std::operator<<((ostream *)&std::cerr,"  Not enough factorization space.\n");
        exit(1);
      }
      if (0 < (long)local_2c) {
        iVar2 = 1;
        lVar3 = 0;
        do {
          iVar1 = local_d8[lVar3];
          dVar4 = pow((double)iVar1,(double)(factor[lVar3 + 0x12] + -1));
          iVar2 = (iVar1 + -1) * iVar2 * (int)dVar4;
          lVar3 = lVar3 + 1;
        } while (local_2c != lVar3);
      }
    }
  }
  return iVar2;
}

Assistant:

BURKHARDT_EXPORT
int phi ( int n )

//****************************************************************************80
//
//  Purpose:
//
//    PHI computes the number of relatively prime predecessors of an integer.
//
//  Discussion:
//
//    PHI(N) is the number of integers between 1 and N which are
//    relatively prime to N.  I and J are relatively prime if they
//    have no common factors.  The function PHI(N) is known as
//    "Euler's totient function".
//
//    By convention, 1 and N are relatively prime.
//
//    The formula is:
//
//      PHI(U*V) = PHI(U) * PHI(V) if U and V are relatively prime.
// 
//      PHI(P**K) = P^(K-1) * ( P - 1 ) if P is prime.
//
//      PHI(N) = N * Product ( P divides N ) ( 1 - 1 / P )
//
//      N = Sum ( D divides N ) PHI(D).
//
//  First values:
//
//     N  PHI(N)
//
//     1    1
//     2    1
//     3    2
//     4    2
//     5    4
//     6    2
//     7    6
//     8    4
//     9    6
//    10    4
//    11   10
//    12    4
//    13   12
//    14    6
//    15    8
//    16    8
//    17   16
//    18    6
//    19   18
//    20    8
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
//
//    12 May 2003
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, int N, the value to be analyzed.
//
//    Output, int PHI, the value of PHI(N).  If N is less than
//    or equal to 0, PHI will be returned as 0.  If there is not enough
//    room for full factoring of N, PHI will be returned as -1.
//
{
# define FACTOR_MAX 20

  int factor[FACTOR_MAX];
  int i;
  int nfactor;
  int nleft;
  int power[FACTOR_MAX];
  int value;

  if ( n <= 0 )
  {
    return 0;
  }

  if ( n == 1 )
  {
    return 1;
  }
//
//  Factor N.
//
  i4_factor ( n, FACTOR_MAX, nfactor, factor, power, nleft );

  if ( nleft != 1 )
  {
    std::cerr << "\n";
    std::cerr << "PHI - Fatal error!\n";
    std::cerr << "  Not enough factorization space.\n";
    exit ( 1 );
  }

  value = 1;
  for ( i = 0; i < nfactor; i++ )
  {
    value = value *  int(pow( double(factor[i]), power[i]-1 ))
      * ( factor[i] - 1 );
  }

  return value;
# undef FACTOR_MAX
}